

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O1

DdManager * Aig_ManBuildPoBdd(Aig_Man_t *p,DdNode **pbFunc)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  DdManager *unique;
  DdNode *pDVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  if (p->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigSplit.c"
                  ,200,"DdManager *Aig_ManBuildPoBdd(Aig_Man_t *, DdNode **)");
  }
  Aig_ManCleanData(p);
  unique = Cudd_Init(p->nObjs[2],0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  pAVar1 = p->pConst1;
  pDVar3 = Cudd_ReadOne(unique);
  (pAVar1->field_5).pData = pDVar3;
  Cudd_Ref(pDVar3);
  pVVar4 = p->vCis;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar5];
      pDVar3 = Cudd_bddIthVar(unique,(int)lVar5);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar3;
      Cudd_Ref(pDVar3);
      lVar5 = lVar5 + 1;
      pVVar4 = p->vCis;
    } while (lVar5 < pVVar4->nSize);
  }
  if (0 < p->vCos->nSize) {
    pvVar2 = *p->vCos->pArray;
    pDVar3 = Aig_ManBuildPoBdd_rec
                       (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),unique);
    *pbFunc = pDVar3;
    Cudd_Ref(pDVar3);
    *pbFunc = (DdNode *)((ulong)*pbFunc ^ (ulong)((uint)*(undefined8 *)((long)pvVar2 + 8) & 1));
    pVVar4 = p->vObjs;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        if ((pVVar4->pArray[lVar5] != (void *)0x0) &&
           (pDVar3 = *(DdNode **)((long)pVVar4->pArray[lVar5] + 0x28), pDVar3 != (DdNode *)0x0)) {
          Cudd_RecursiveDeref(unique,pDVar3);
        }
        lVar5 = lVar5 + 1;
        pVVar4 = p->vObjs;
      } while (lVar5 < pVVar4->nSize);
    }
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
    return unique;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

DdManager * Aig_ManBuildPoBdd( Aig_Man_t * p, DdNode ** pbFunc )
{
    DdManager * dd;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManCleanData( p );
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    pObj = Aig_ManConst1(p);
    pObj->pData = Cudd_ReadOne(dd);  Cudd_Ref( (DdNode *)pObj->pData );
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Cudd_bddIthVar(dd, i);  Cudd_Ref( (DdNode *)pObj->pData );
    }
    pObj = Aig_ManCo( p, 0 );
    *pbFunc = Aig_ManBuildPoBdd_rec( p, Aig_ObjFanin0(pObj), dd );  Cudd_Ref( *pbFunc );
    *pbFunc = Cudd_NotCond( *pbFunc, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Cudd_ReduceHeap( dd,  CUDD_REORDER_SYMM_SIFT, 1 );
    return dd;
}